

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
          (string *__return_storage_ptr__,str_format_internal *this,UntypedFormatSpecImpl format,
          Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args)

{
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  UntypedFormatSpecImpl format_00;
  bool bVar1;
  FormatRawSinkImpl local_48;
  undefined1 local_31;
  pointer pFStack_30;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_local;
  UntypedFormatSpecImpl format_local;
  string *out;
  
  args_local.ptr_ = args.ptr_;
  pFStack_30 = (pointer)format.size_;
  local_31 = 0;
  args_local.len_ = (size_type)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  FormatRawSinkImpl::
  FormatRawSinkImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (&local_48,__return_storage_ptr__);
  format_00.size_ = (size_t)format.data_;
  format_00.data_ = (void *)args_local.len_;
  args_00.len_ = (size_type)args_local.ptr_;
  args_00.ptr_ = pFStack_30;
  bVar1 = FormatUntyped(local_48,format_00,args_00);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::__cxx11::string::clear();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatPack(UntypedFormatSpecImpl format,
                       absl::Span<const FormatArgImpl> args) {
  std::string out;
  if (ABSL_PREDICT_FALSE(!FormatUntyped(&out, format, args))) {
    out.clear();
  }
  return out;
}